

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.h
# Opt level: O3

void __thiscall ChunkedStackPool<4092>::~ChunkedStackPool(ChunkedStackPool<4092> *this)

{
  StackChunk *pSVar1;
  StackChunk *pSVar2;
  
  pSVar2 = this->first;
  while (pSVar2 != (StackChunk *)0x0) {
    pSVar1 = pSVar2->next;
    (*(code *)NULLC::dealloc)(pSVar2);
    this->first = pSVar1;
    pSVar2 = pSVar1;
  }
  this->first = (StackChunk *)0x0;
  this->curr = (StackChunk *)0x0;
  this->size = 0xffc;
  return;
}

Assistant:

~ChunkedStackPool()
	{
		Reset();
	}